

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O1

void __thiscall nite::Renderable::~Renderable(Renderable *this)

{
  Program *this_00;
  pointer ppPVar1;
  pointer ppPVar2;
  ulong uVar3;
  
  this->_vptr_Renderable = (_func_int **)&PTR__Renderable_00299740;
  ppPVar2 = (this->programs).super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar1 = (this->programs).super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar1 != ppPVar2) {
    uVar3 = 0;
    do {
      this_00 = ppPVar2[uVar3];
      if (this_00 != (Program *)0x0) {
        Program::~Program(this_00);
        operator_delete(this_00);
      }
      uVar3 = uVar3 + 1;
      ppPVar2 = (this->programs).
                super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppPVar1 = (this->programs).
                super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (uVar3 < (ulong)((long)ppPVar1 - (long)ppPVar2 >> 3));
  }
  if (ppPVar1 != ppPVar2) {
    (this->programs).super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar2;
  }
  if (ppPVar2 != (pointer)0x0) {
    operator_delete(ppPVar2);
    return;
  }
  return;
}

Assistant:

nite::Renderable::~Renderable(){
	for(int i = 0; i < programs.size(); ++i){
		//programs[i]->~Program();
		delete programs[i];
	}
	programs.clear();
}